

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::Q3BSPFileImporter::findFirstMapInArchive
          (Q3BSPFileImporter *this,ZipArchiveIOSystem *bspArchive,string *mapName)

{
  long lVar1;
  bool bVar2;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_48;
  
  std::__cxx11::string::assign((char *)mapName);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"bsp",&local_69);
  ZipArchiveIOSystem::getFileListExtension(bspArchive,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pbVar3 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (; pbVar3 != local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      lVar1 = std::__cxx11::string::find((char *)pbVar3,0x5df7f4);
      if ((lVar1 != -1) &&
         (lVar1 = std::__cxx11::string::find((char *)pbVar3,0x5df7fa), lVar1 != -1)) {
        bVar2 = true;
        std::__cxx11::string::_M_assign((string *)mapName);
        goto LAB_004c0708;
      }
    }
  }
  bVar2 = false;
LAB_004c0708:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return bVar2;
}

Assistant:

bool Q3BSPFileImporter::findFirstMapInArchive(ZipArchiveIOSystem &bspArchive, std::string &mapName ) {
    mapName = "";
    std::vector<std::string> fileList;
    bspArchive.getFileListExtension( fileList, "bsp" );
    if (fileList.empty()) {
        return false;
    }

    std::vector<std::string>::iterator it( fileList.begin() );
    for ( ; it != fileList.end(); ++it ) {
        const std::string::size_type pos = (*it).find( "maps/" );
        if ( std::string::npos != pos ) {
            std::string::size_type extPos = (*it).find( ".bsp" );
            if ( std::string::npos != extPos ) {
                mapName = *it;
                return true;
            }
        }
    }

    return false;
}